

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  bool bVar1;
  Section SVar2;
  int iVar3;
  Sense SVar4;
  Verbosity VVar5;
  long in_RCX;
  long in_RDX;
  istream *in_RSI;
  long *in_RDI;
  DIdxSet *in_stack_00000010;
  NameSet *in_stack_00000018;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000020;
  NameSet *in_stack_00000028;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000030;
  MPSInput *in_stack_00000038;
  Verbosity old_verbosity;
  MPSInput mps;
  SPxMemoryException *x;
  NameSet *cnames;
  NameSet *rnames;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *cset;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rset;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  byte bVar6;
  int in_stack_fffffffffffffbe4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbe8;
  SPxOut *in_stack_fffffffffffffbf8;
  MPSInput *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  Real in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  NameSet *in_stack_fffffffffffffc20;
  undefined4 local_3c8;
  Verbosity local_3c4 [36];
  int in_stack_fffffffffffffccc;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd0;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffce0;
  SPxOut *in_stack_fffffffffffffe68;
  NameSet *in_stack_fffffffffffffe70;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe78;
  MPSInput *in_stack_fffffffffffffe80;
  SPxOut *in_stack_ffffffffffffff68;
  DIdxSet *in_stack_ffffffffffffff70;
  NameSet *in_stack_ffffffffffffff78;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff80;
  MPSInput *in_stack_ffffffffffffff88;
  SPxOut *in_stack_ffffffffffffff90;
  NameSet *in_stack_ffffffffffffff98;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  MPSInput *in_stack_ffffffffffffffa8;
  
  if (in_RCX == 0) {
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    NameSet::NameSet(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,
                     (Real)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  }
  NameSet::clear((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  if (in_RDX == 0) {
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    NameSet::NameSet((NameSet *)0x0,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,
                     (Real)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  }
  NameSet::clear((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  clear(in_stack_fffffffffffffbe8);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  MPSInput::MPSInput((MPSInput *)(local_3c4 + 1),in_RSI);
  MPSreadName(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == OBJSEN) {
    MPSreadObjsen((MPSInput *)0x303b61);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == OBJNAME) {
    MPSreadObjname((MPSInput *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == ROWS) {
    MPSreadRows<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
  }
  iVar3 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::num((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x303beb);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar3);
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == COLUMNS) {
    MPSreadCols<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
               in_stack_00000018,in_stack_00000010);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == RHS) {
    MPSreadRhs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == RANGES) {
    MPSreadRanges<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((MPSInput *)mps.m_probname._72_8_,
               (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)mps.m_probname._64_8_,(NameSet *)mps.m_probname._56_8_,
               (SPxOut *)mps.m_probname._48_8_);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == BOUNDS) {
    MPSreadBounds<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 != ENDATA) {
    MPSInput::syntaxError((MPSInput *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))
    ;
  }
  bVar1 = MPSInput::hasError((MPSInput *)(local_3c4 + 1));
  if (bVar1) {
    (**(code **)(*in_RDI + 0xd8))();
  }
  else {
    SVar4 = MPSInput::objSense((MPSInput *)(local_3c4 + 1));
    (**(code **)(*in_RDI + 0x228))(in_RDI,((SVar4 != MINIMIZE) - 1) + (uint)(SVar4 != MINIMIZE));
    if ((in_RDI[0x3b] != 0) &&
       (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3b]), 3 < (int)VVar5)) {
      local_3c4[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[0x3b]);
      local_3c8 = 4;
      (**(code **)(*(long *)in_RDI[0x3b] + 0x10))((long *)in_RDI[0x3b],&local_3c8);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                         (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      MPSInput::objSense((MPSInput *)(local_3c4 + 1));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                         (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      (**(code **)(*(long *)in_RDI[0x3b] + 0x10))((long *)in_RDI[0x3b],local_3c4);
    }
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x303e77);
    added2Set(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
              in_stack_fffffffffffffccc);
    in_stack_fffffffffffffbe4 =
         LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x303ea2);
    (**(code **)(*in_RDI + 0x288))(in_RDI,in_stack_fffffffffffffbe4);
  }
  if (in_RCX == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    spx_free<soplex::NameSet*>((NameSet **)0x303ee6);
  }
  if (in_RDX == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    spx_free<soplex::NameSet*>((NameSet **)0x303f0b);
  }
  bVar1 = MPSInput::hasError((MPSInput *)(local_3c4 + 1));
  bVar6 = bVar1 ^ 0xff;
  MPSInput::~MPSInput((MPSInput *)(local_3c4 + 1));
  return (bool)(bVar6 & 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}